

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution_x86_fma::create_pipeline(Deconvolution_x86_fma *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  Allocator *pAVar3;
  int k;
  int iVar4;
  Layer *pLVar5;
  ulong uVar6;
  int i;
  void *pvVar7;
  ulong uVar8;
  undefined4 *puVar9;
  int iVar10;
  long lVar11;
  Option *pOVar12;
  _func_int ***ppp_Var13;
  undefined4 *puVar14;
  long lVar15;
  ulong uVar16;
  _func_int ***ppp_Var17;
  int iVar18;
  ulong uVar19;
  _func_int ***ppp_Var20;
  int iVar21;
  ulong uVar22;
  _func_int ***ppp_Var23;
  int k_1;
  int _h;
  long lVar24;
  Deconvolution_x86_fma *pDVar25;
  int i_00;
  ulong uVar26;
  ParamDict pd;
  ParamDict pd_5;
  Mat local_148;
  ulong local_f8;
  ParamDict local_f0;
  Allocator *local_e0;
  Mat local_d8;
  Deconvolution_x86_fma *local_88;
  ulong local_80;
  int local_74;
  Option *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  long local_48;
  ModelBinFromMatArray local_40;
  
  if ((this->super_Deconvolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Deconvolution).activation_type) {
  case 1:
    pLVar5 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 2:
    pLVar5 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_Deconvolution).activation_params.data);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 3:
    pLVar5 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 4:
    pLVar5 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 5:
    pLVar5 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 6:
    pLVar5 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_002a6585;
  }
  ParamDict::~ParamDict((ParamDict *)&local_148);
LAB_002a6585:
  if (pLVar5 != (Layer *)0x0) {
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
  }
  this->activation = pLVar5;
  uVar22 = (long)(this->super_Deconvolution).kernel_h * (long)(this->super_Deconvolution).kernel_w;
  uVar1 = (this->super_Deconvolution).num_output;
  iVar21 = (int)uVar22;
  uVar26 = (long)(this->super_Deconvolution).weight_data_size / (long)iVar21;
  uVar16 = (long)((ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff) /
           (long)(int)uVar1;
  uVar26 = 1;
  local_f8 = 1;
  if (opt->use_packing_layout == true) {
    local_f8 = (ulong)((uVar16 & 3) == 0) * 3 + 1;
    if ((uVar16 & 7) == 0) {
      local_f8 = 8;
    }
    uVar26 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    if ((uVar1 & 7) == 0) {
      uVar26 = 8;
    }
  }
  _h = (int)uVar16;
  i_00 = (int)uVar26;
  local_88 = this;
  local_70 = opt;
  local_58 = uVar22;
  if (opt->use_sgemm_convolution == true) {
    pLVar5 = create_layer_cpu(0x4a);
    this->gemm = pLVar5;
    ParamDict::ParamDict(&local_f0);
    ParamDict::set(&local_f0,2,1);
    ParamDict::set(&local_f0,3,0);
    ParamDict::set(&local_f0,4,1);
    ParamDict::set(&local_f0,5,0);
    ParamDict::set(&local_f0,6,1);
    ParamDict::set(&local_f0,7,(this->super_Deconvolution).num_output * iVar21);
    ParamDict::set(&local_f0,8,0);
    ParamDict::set(&local_f0,9,_h);
    ParamDict::set(&local_f0,10,-1);
    ParamDict::set(&local_f0,0xb,0);
    ParamDict::set(&local_f0,0xc,i_00);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_f0);
    local_148.cstep = 0;
    local_148.data = (Allocator *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elempack = 0;
    local_148._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    local_148.elemsize._4_4_ = (int)local_148.refcount;
    local_148.allocator = (Allocator *)local_148.data;
    local_148.dims = (int)local_148.refcount;
    local_148.w = local_148.refcount._4_4_;
    local_148.c = local_148.elempack;
    Mat::reshape(&local_d8,&(this->super_Deconvolution).weight_data,iVar21,_h,
                 (this->super_Deconvolution).num_output,(Allocator *)0x0);
    Mat::create(&local_148,(this->super_Deconvolution).num_output * iVar21,_h,4,(Allocator *)0x0);
    pOVar12 = local_70;
    pDVar25 = local_88;
    if (0 < _h) {
      local_e0 = (Allocator *)local_148.data;
      local_f8 = (long)local_148.w *
                 CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      iVar21 = (local_88->super_Deconvolution).num_output;
      local_80 = uVar16 & 0xffffffff;
      uVar16 = uVar22 & 0xffffffff;
      uVar19 = 0;
      do {
        if (i_00 <= iVar21) {
          ppp_Var13 = (_func_int ***)
                      ((long)(_func_int ***)local_d8.data +
                      CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar19 *
                      (long)local_d8.w);
          lVar11 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * local_d8.cstep;
          ppp_Var20 = (_func_int ***)((long)(_func_int ***)local_148.data + local_f8 * uVar19);
          lVar24 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar6 = 0;
              uVar22 = uVar26;
              ppp_Var17 = ppp_Var13;
              ppp_Var23 = ppp_Var13;
              do {
                do {
                  *(undefined4 *)ppp_Var20 = *(undefined4 *)ppp_Var17;
                  ppp_Var20 = (_func_int ***)((long)ppp_Var20 + 4);
                  uVar22 = uVar22 - 1;
                  ppp_Var17 = (_func_int ***)((long)ppp_Var17 + lVar11);
                } while (uVar22 != 0);
                uVar6 = uVar6 + 1;
                ppp_Var17 = (_func_int ***)((long)ppp_Var23 + 4);
                uVar22 = uVar26;
                ppp_Var23 = ppp_Var17;
              } while (uVar6 != uVar16);
            }
            lVar24 = lVar24 + uVar26;
            ppp_Var13 = (_func_int ***)((long)ppp_Var13 + lVar11 * uVar26);
            uVar22 = local_58;
          } while (lVar24 < (long)((long)iVar21 - (ulong)(i_00 - 1)));
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_80);
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_d8.data = local_148.data;
    local_d8.refcount._0_4_ = (int)local_148.refcount;
    local_d8.refcount._4_4_ = local_148.refcount._4_4_;
    local_d8.elemsize._0_4_ = (undefined4)local_148.elemsize;
    local_d8.elemsize._4_4_ = local_148.elemsize._4_4_;
    local_d8.elempack = local_148.elempack;
    local_d8.allocator = local_148.allocator;
    local_d8.dims = local_148.dims;
    local_d8.w = local_148.w;
    local_d8.h = local_148.h;
    local_d8.d = local_148.d;
    local_d8.c = local_148.c;
    local_d8.cstep = local_148.cstep;
    pLVar5 = pDVar25->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*pDVar25->gemm->_vptr_Layer[4])(pDVar25->gemm,pOVar12);
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_148.data != (Allocator *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    ParamDict::~ParamDict(&local_f0);
  }
  else {
    local_148.cstep = 0;
    local_148.data = (Allocator *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elempack = 0;
    local_148._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    iVar10 = 0;
    local_148.elemsize._4_4_ = (int)local_148.refcount;
    local_148.allocator = (Allocator *)local_148.data;
    local_148.dims = (int)local_148.refcount;
    local_148.w = local_148.refcount._4_4_;
    local_148.c = local_148.elempack;
    Mat::create(&local_148,(this->super_Deconvolution).weight_data.w,4,(Allocator *)0x0);
    iVar18 = (this->super_Deconvolution).num_output;
    iVar4 = iVar18 * _h;
    uVar19 = uVar22 & 0xffffffff;
    if (0 < iVar4) {
      pvVar7 = (this->super_Deconvolution).weight_data.data;
      puVar9 = (undefined4 *)((long)local_148.data + uVar22 * 4 + -4);
      do {
        if (0 < iVar21) {
          uVar6 = 0;
          puVar14 = puVar9;
          do {
            *puVar14 = *(undefined4 *)((long)pvVar7 + uVar6 * 4);
            uVar6 = uVar6 + 1;
            puVar14 = puVar14 + -1;
          } while (uVar19 != uVar6);
        }
        iVar10 = iVar10 + 1;
        pvVar7 = (void *)((long)pvVar7 + uVar22 * 4);
        puVar9 = puVar9 + uVar22;
      } while (iVar10 != iVar4);
    }
    Mat::reshape(&local_d8,&local_148,iVar21,_h,iVar18,(Allocator *)0x0);
    iVar18 = (int)local_f8 * i_00;
    Mat::create(&this->weight_data_tm,iVar21,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
                     (long)(int)local_f8),(this->super_Deconvolution).num_output / i_00,
                (ulong)(uint)(iVar18 * 4),iVar18,(Allocator *)0x0);
    pOVar12 = local_70;
    pDVar25 = local_88;
    iVar21 = (this->super_Deconvolution).num_output;
    local_60 = (long)iVar21;
    if (i_00 <= iVar21) {
      local_48 = (local_88->weight_data_tm).cstep * (local_88->weight_data_tm).elemsize;
      local_50 = (local_88->weight_data_tm).data;
      uVar16 = local_f8 & 0xffffffff;
      local_80 = (long)_h - (ulong)((int)local_f8 - 1);
      local_60 = local_60 - (ulong)(i_00 - 1);
      local_e0 = (Allocator *)0x0;
      do {
        if ((int)local_f8 <= _h) {
          puVar9 = (undefined4 *)
                   ((int)(((ulong)local_e0 & 0xffffffff) / uVar26) * local_48 + (long)local_50);
          lVar24 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          ppp_Var20 = (_func_int ***)((long)(_func_int ***)local_d8.data + lVar24 * (long)local_e0);
          lVar11 = (long)local_d8.w *
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          lVar15 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar22 = 0;
              ppp_Var13 = ppp_Var20;
              do {
                uVar8 = 0;
                ppp_Var17 = ppp_Var13;
                uVar6 = uVar26;
                ppp_Var23 = ppp_Var13;
                do {
                  do {
                    *puVar9 = *(undefined4 *)ppp_Var17;
                    puVar9 = puVar9 + 1;
                    uVar6 = uVar6 - 1;
                    ppp_Var17 = (_func_int ***)((long)ppp_Var17 + lVar24);
                  } while (uVar6 != 0);
                  uVar8 = uVar8 + 1;
                  ppp_Var17 = (_func_int ***)((long)ppp_Var23 + lVar11);
                  uVar6 = uVar26;
                  ppp_Var23 = ppp_Var17;
                } while (uVar8 != uVar16);
                uVar22 = uVar22 + 1;
                ppp_Var13 = (_func_int ***)((long)ppp_Var13 + 4);
              } while (uVar22 != uVar19);
            }
            lVar15 = lVar15 + uVar16;
            ppp_Var20 = (_func_int ***)((long)ppp_Var20 + lVar11 * uVar16);
            uVar22 = local_58;
          } while (lVar15 < (long)local_80);
        }
        local_e0 = (Allocator *)((long)&local_e0->_vptr_Allocator + uVar26);
        local_74 = _h;
      } while ((long)local_e0 < local_60);
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    local_68 = uVar26;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_148.data != (Allocator *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
  }
  if (pOVar12->lightmode == true) {
    piVar2 = (pDVar25->super_Deconvolution).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar7 = (pDVar25->super_Deconvolution).weight_data.data;
        pAVar3 = (pDVar25->super_Deconvolution).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (pDVar25->super_Deconvolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&(pDVar25->super_Deconvolution).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(pDVar25->super_Deconvolution).weight_data.elemsize + 4) = 0;
    (pDVar25->super_Deconvolution).weight_data.data = (void *)0x0;
    (pDVar25->super_Deconvolution).weight_data.refcount = (int *)0x0;
    (pDVar25->super_Deconvolution).weight_data.dims = 0;
    (pDVar25->super_Deconvolution).weight_data.w = 0;
    (pDVar25->super_Deconvolution).weight_data.h = 0;
    (pDVar25->super_Deconvolution).weight_data.d = 0;
    (pDVar25->super_Deconvolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}